

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

bool __thiscall
sf::priv::RenderTextureImplFBO::create
          (RenderTextureImplFBO *this,uint width,uint height,uint textureId,
          ContextSettings *settings)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  Uint64 UVar3;
  undefined4 in_ECX;
  GLsizei in_EDX;
  GLenum GVar4;
  GLsizei in_ESI;
  long in_RDI;
  int *in_R8;
  RenderTextureImplFBO *in_stack_00000008;
  GLint drawFramebuffer;
  GLint readFramebuffer;
  GLuint depthStencil_3;
  GLuint depthStencil_2;
  GLuint color;
  GLuint depthStencil_1;
  GLuint depthStencil;
  GLint samples;
  TransientContextLock lock;
  TransientContextLock *in_stack_ffffffffffffff10;
  TransientContextLock *in_stack_ffffffffffffff20;
  GLuint local_60;
  GLuint local_5c;
  GLuint local_58;
  GLuint local_54;
  GLuint local_50;
  GLuint local_4c;
  GLuint local_48;
  uint local_44;
  int local_40;
  int *local_28;
  undefined4 local_1c;
  GLsizei local_18;
  GLsizei local_14;
  byte local_1;
  
  *(GLsizei *)(in_RDI + 0x70) = in_ESI;
  *(GLsizei *)(in_RDI + 0x74) = in_EDX;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffff20);
  ensureExtensionsInit();
  if ((local_28[2] == 0) ||
     ((SF_GLAD_GL_EXT_framebuffer_multisample != 0 && (SF_GLAD_GL_EXT_framebuffer_blit != 0)))) {
    if ((local_28[1] == 0) || (SF_GLAD_GL_EXT_packed_depth_stencil != 0)) {
      *(bool *)(in_RDI + 0x86) = (*(byte *)(local_28 + 6) & 1) != 0;
      if (local_28[2] != 0) {
        local_44 = 0;
        (*sf_glad_glGetIntegerv)(0x8d57,(GLint *)&local_44);
        if (local_44 < (uint)local_28[2]) {
          poVar2 = err();
          std::operator<<(poVar2,
                          "Impossible to create render texture (unsupported anti-aliasing level)");
          poVar2 = err();
          poVar2 = std::operator<<(poVar2," Requested: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28[2]);
          poVar2 = std::operator<<(poVar2," Maximum supported: ");
          this_00 = (void *)std::ostream::operator<<(poVar2,local_44);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          local_40 = 1;
          goto LAB_002d79dc;
        }
      }
      if (local_28[2] == 0) {
        if (local_28[1] == 0) {
          if (*local_28 != 0) {
            local_4c = 0;
            (*sf_glad_glGenRenderbuffersEXT)(1,&local_4c);
            *(GLuint *)(in_RDI + 0x68) = local_4c;
            if (*(int *)(in_RDI + 0x68) == 0) {
              poVar2 = err();
              poVar2 = std::operator<<(poVar2,
                                       "Impossible to create render texture (failed to create the attached depth buffer)"
                                      );
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              local_40 = 1;
              goto LAB_002d79dc;
            }
            (*sf_glad_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x68));
            (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x1902,local_14,local_18);
          }
        }
        else {
          local_48 = 0;
          (*sf_glad_glGenRenderbuffersEXT)(1,&local_48);
          *(GLuint *)(in_RDI + 0x68) = local_48;
          if (*(int *)(in_RDI + 0x68) == 0) {
            poVar2 = err();
            poVar2 = std::operator<<(poVar2,
                                     "Impossible to create render texture (failed to create the attached depth/stencil buffer)"
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            local_1 = 0;
            local_40 = 1;
            goto LAB_002d79dc;
          }
          (*sf_glad_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x68));
          (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x88f0,local_14,local_18);
          *(undefined1 *)(in_RDI + 0x85) = 1;
        }
      }
      else {
        local_50 = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1,&local_50);
        *(GLuint *)(in_RDI + 0x6c) = local_50;
        if (*(int *)(in_RDI + 0x6c) == 0) {
          poVar2 = err();
          poVar2 = std::operator<<(poVar2,
                                   "Impossible to create render texture (failed to create the attached multisample color buffer)"
                                  );
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          local_1 = 0;
          local_40 = 1;
          goto LAB_002d79dc;
        }
        (*sf_glad_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x6c));
        GVar4 = 0x1908;
        if ((*(byte *)(in_RDI + 0x86) & 1) != 0) {
          GVar4 = 0x8c43;
        }
        (*sf_glad_glRenderbufferStorageMultisampleEXT)(0x8d41,local_28[2],GVar4,local_14,local_18);
        if (local_28[1] == 0) {
          if (*local_28 != 0) {
            local_58 = 0;
            (*sf_glad_glGenRenderbuffersEXT)(1,&local_58);
            *(GLuint *)(in_RDI + 0x68) = local_58;
            if (*(int *)(in_RDI + 0x68) == 0) {
              poVar2 = err();
              in_stack_ffffffffffffff10 =
                   (TransientContextLock *)
                   std::operator<<(poVar2,
                                   "Impossible to create render texture (failed to create the attached multisample depth buffer)"
                                  );
              std::ostream::operator<<
                        (in_stack_ffffffffffffff10,std::endl<char,std::char_traits<char>>);
              local_1 = 0;
              local_40 = 1;
              goto LAB_002d79dc;
            }
            (*sf_glad_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x68));
            (*sf_glad_glRenderbufferStorageMultisampleEXT)
                      (0x8d41,local_28[2],0x1902,local_14,local_18);
          }
        }
        else {
          local_54 = 0;
          (*sf_glad_glGenRenderbuffersEXT)(1,&local_54);
          *(GLuint *)(in_RDI + 0x68) = local_54;
          if (*(int *)(in_RDI + 0x68) == 0) {
            poVar2 = err();
            poVar2 = std::operator<<(poVar2,
                                     "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)"
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            local_1 = 0;
            local_40 = 1;
            goto LAB_002d79dc;
          }
          (*sf_glad_glBindRenderbufferEXT)(0x8d41,*(GLuint *)(in_RDI + 0x68));
          (*sf_glad_glRenderbufferStorageMultisampleEXT)
                    (0x8d41,local_28[2],0x88f0,local_14,local_18);
          *(undefined1 *)(in_RDI + 0x85) = 1;
        }
        *(undefined1 *)(in_RDI + 0x84) = 1;
      }
      local_40 = 0;
    }
    else {
      local_1 = 0;
      local_40 = 1;
    }
  }
  else {
    local_1 = 0;
    local_40 = 1;
  }
LAB_002d79dc:
  GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffff10);
  if (local_40 == 0) {
    *(undefined4 *)(in_RDI + 0x80) = local_1c;
    UVar3 = Context::getActiveContextId();
    if (UVar3 == 0) {
      local_1 = 1;
    }
    else {
      local_5c = 0;
      local_60 = 0;
      (*sf_glad_glGetIntegerv)(0x8caa,(GLint *)&local_5c);
      (*sf_glad_glGetIntegerv)(0x8ca6,(GLint *)&local_60);
      bVar1 = createFrameBuffer(in_stack_00000008);
      if (bVar1) {
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,local_5c);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,local_60);
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RenderTextureImplFBO::create(unsigned int width, unsigned int height, unsigned int textureId, const ContextSettings& settings)
{
    // Store the dimensions
    m_width = width;
    m_height = height;

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        if (settings.antialiasingLevel && !(GLEXT_framebuffer_multisample && GLEXT_framebuffer_blit))
            return false;

        if (settings.stencilBits && !GLEXT_packed_depth_stencil)
            return false;

        m_sRgb = settings.sRgbCapable && GL_EXT_texture_sRGB;

#ifndef SFML_OPENGL_ES

        // Check if the requested anti-aliasing level is supported
        if (settings.antialiasingLevel)
        {
            GLint samples = 0;
            glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

            if (settings.antialiasingLevel > static_cast<unsigned int>(samples))
            {
                err() << "Impossible to create render texture (unsupported anti-aliasing level)";
                err() << " Requested: " << settings.antialiasingLevel << " Maximum supported: " << samples << std::endl;
                return false;
            }
        }

#endif


        if (!settings.antialiasingLevel)
        {
            // Create the depth/stencil buffer if requested
            if (settings.stencilBits)
            {

#ifndef SFML_OPENGL_ES

                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

#else

                err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                return false;

#endif // SFML_OPENGL_ES

                m_stencil = true;

            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }
        }
        else
        {

#ifndef SFML_OPENGL_ES

            // Create the multisample color buffer
            GLuint color = 0;
            glCheck(GLEXT_glGenRenderbuffers(1, &color));
            m_colorBuffer = color;
            if (!m_colorBuffer)
            {
                err() << "Impossible to create render texture (failed to create the attached multisample color buffer)" << std::endl;
                return false;
            }
            glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
            glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), m_sRgb ? GL_SRGB8_ALPHA8_EXT : GL_RGBA, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

            // Create the multisample depth/stencil buffer if requested
            if (settings.stencilBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

                m_stencil = true;
            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }

#else

            err() << "Impossible to create render texture (failed to create the multisample render buffers)" << std::endl;
            return false;

#endif // SFML_OPENGL_ES

            m_multisample = true;

        }
    }

    // Save our texture ID in order to be able to attach it to an FBO at any time
    m_textureId = textureId;

    // We can't create an FBO now if there is no active context
    if (!Context::getActiveContextId())
        return true;

#ifndef SFML_OPENGL_ES

    // Save the current bindings so we can restore them after we are done
    GLint readFramebuffer = 0;
    GLint drawFramebuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
    glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, static_cast<GLuint>(readFramebuffer)));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, static_cast<GLuint>(drawFramebuffer)));

        return true;
    }

#else

    // Save the current binding so we can restore them after we are done
    GLint frameBuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &frameBuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, static_cast<GLuint>(frameBuffer)));

        return true;
    }

#endif

    return false;
}